

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O2

RAMReport * __thiscall celero::RAMReport::operator-(RAMReport *this,RAMReport *x)

{
  long lVar1;
  long lVar2;
  RAMReport *in_RDI;
  
  lVar1 = this->RamSystemAvailable;
  lVar2 = x->RamSystemAvailable;
  in_RDI->RamSystemTotal = this->RamSystemTotal - x->RamSystemTotal;
  in_RDI->RamSystemAvailable = lVar1 - lVar2;
  lVar1 = this->RamSystemUsedByCurrentProcess;
  lVar2 = x->RamSystemUsedByCurrentProcess;
  in_RDI->RamSystemUsed = this->RamSystemUsed - x->RamSystemUsed;
  in_RDI->RamSystemUsedByCurrentProcess = lVar1 - lVar2;
  lVar1 = this->RamPhysicalAvailable;
  lVar2 = x->RamPhysicalAvailable;
  in_RDI->RamPhysicalTotal = this->RamPhysicalTotal - x->RamPhysicalTotal;
  in_RDI->RamPhysicalAvailable = lVar1 - lVar2;
  lVar1 = this->RamPhysicalUsedByCurrentProcess;
  lVar2 = x->RamPhysicalUsedByCurrentProcess;
  in_RDI->RamPhysicalUsed = this->RamPhysicalUsed - x->RamPhysicalUsed;
  in_RDI->RamPhysicalUsedByCurrentProcess = lVar1 - lVar2;
  lVar1 = this->RamVirtualTotal;
  lVar2 = x->RamVirtualTotal;
  in_RDI->RamPhysicalUsedByCurrentProcessPeak =
       this->RamPhysicalUsedByCurrentProcessPeak - x->RamPhysicalUsedByCurrentProcessPeak;
  in_RDI->RamVirtualTotal = lVar1 - lVar2;
  lVar1 = this->RamVirtualUsed;
  lVar2 = x->RamVirtualUsed;
  in_RDI->RamVirtualAvailable = this->RamVirtualAvailable - x->RamVirtualAvailable;
  in_RDI->RamVirtualUsed = lVar1 - lVar2;
  in_RDI->RamVirtualUsedByCurrentProcess =
       this->RamVirtualUsedByCurrentProcess - x->RamVirtualUsedByCurrentProcess;
  return in_RDI;
}

Assistant:

celero::RAMReport celero::RAMReport::operator-(const RAMReport& x)
{
	celero::RAMReport r;
	r.RamSystemTotal = this->RamSystemTotal - x.RamSystemTotal;
	r.RamSystemAvailable = this->RamSystemAvailable - x.RamSystemAvailable;
	r.RamSystemUsed = this->RamSystemUsed - x.RamSystemUsed;
	r.RamSystemUsedByCurrentProcess = this->RamSystemUsedByCurrentProcess - x.RamSystemUsedByCurrentProcess;
	r.RamPhysicalTotal = this->RamPhysicalTotal - x.RamPhysicalTotal;
	r.RamPhysicalAvailable = this->RamPhysicalAvailable - x.RamPhysicalAvailable;
	r.RamPhysicalUsed = this->RamPhysicalUsed - x.RamPhysicalUsed;
	r.RamPhysicalUsedByCurrentProcess = this->RamPhysicalUsedByCurrentProcess - x.RamPhysicalUsedByCurrentProcess;
	r.RamPhysicalUsedByCurrentProcessPeak = this->RamPhysicalUsedByCurrentProcessPeak - x.RamPhysicalUsedByCurrentProcessPeak;
	r.RamVirtualTotal = this->RamVirtualTotal - x.RamVirtualTotal;
	r.RamVirtualAvailable = this->RamVirtualAvailable - x.RamVirtualAvailable;
	r.RamVirtualUsed = this->RamVirtualUsed - x.RamVirtualUsed;
	r.RamVirtualUsedByCurrentProcess = this->RamVirtualUsedByCurrentProcess - x.RamVirtualUsedByCurrentProcess;

	return r;
}